

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuSurface.hpp
# Opt level: O0

RGBA __thiscall tcu::Surface::getPixel(Surface *this,int x,int y)

{
  uint *puVar1;
  deUint32 *pixAddr;
  int pixOffset;
  int y_local;
  int x_local;
  Surface *this_local;
  
  puVar1 = de::ArrayBuffer<unsigned_int,_4UL,_4UL>::getElementPtr
                     (&this->m_pixels,(long)(y * this->m_width + x));
  RGBA::RGBA((RGBA *)((long)&this_local + 4),*puVar1);
  return (RGBA)this_local._4_4_;
}

Assistant:

inline RGBA Surface::getPixel (int x, int y) const
{
	DE_ASSERT(de::inBounds(x, 0, m_width) && de::inBounds(y, 0, m_height));

	const int		pixOffset	= y*m_width + x;
	const deUint32*	pixAddr		= m_pixels.getElementPtr(pixOffset);

	DE_STATIC_ASSERT(RGBA::RED_SHIFT == 0 && RGBA::GREEN_SHIFT == 8 && RGBA::BLUE_SHIFT == 16 && RGBA::ALPHA_SHIFT == 24);

#if (DE_ENDIANNESS == DE_LITTLE_ENDIAN)
	return RGBA(*pixAddr);
#else
	const deUint8*	byteAddr	= (const deUint8*)pixAddr;
	return RGBA(byteAddr[0], byteAddr[1], byteAddr[2], byteAddr[3]);
#endif
}